

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeinject.cc
# Opt level: O0

int4 __thiscall
PcodeInjectLibrary::restoreXmlInject
          (PcodeInjectLibrary *this,string *src,string *nm,int4 tp,Element *el)

{
  uint id;
  InjectPayload *pIVar1;
  int4 injectid;
  Element *el_local;
  int4 tp_local;
  string *nm_local;
  string *src_local;
  PcodeInjectLibrary *this_local;
  
  id = (**this->_vptr_PcodeInjectLibrary)(this,src,nm,(ulong)(uint)tp);
  pIVar1 = getPayload(this,id);
  (*pIVar1->_vptr_InjectPayload[3])(pIVar1,el);
  (*this->_vptr_PcodeInjectLibrary[1])(this,(ulong)id);
  return id;
}

Assistant:

int4 PcodeInjectLibrary::restoreXmlInject(const string &src,const string &nm,int4 tp,const Element *el)

{
  int4 injectid = allocateInject(src, nm, tp);
  getPayload(injectid)->restoreXml(el);
  registerInject(injectid);
  return injectid;
}